

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

int main(int argc,char **argv)

{
  rx_status rVar1;
  rx_test_case *test_cases;
  char *file;
  rx_size test_case_count;
  
  file = (char *)0x0;
  rx_enumerate_test_cases(&test_case_count,(rx_test_case *)0x0);
  if (test_case_count == 0) {
    rVar1 = rx__run_test_cases(0,(rx_test_case *)0x0);
  }
  else {
    test_cases = (rx_test_case *)malloc(test_case_count * 0x38);
    if (test_cases == (rx_test_case *)0x0) {
      rx__log(RX_LOG_LEVEL_ERROR,file,0x14ed,"failed to allocate the test cases\n");
      rVar1 = RX_ERROR_ALLOCATION;
    }
    else {
      rx_enumerate_test_cases(&test_case_count,test_cases);
      rVar1 = rx__run_test_cases(test_case_count,test_cases);
      free(test_cases);
    }
  }
  return (int)(rVar1 != RX_SUCCESS);
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}